

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  array<char,_512UL> *paVar1;
  byte bVar2;
  error_handler_t eVar3;
  element_type *peVar4;
  byte bVar5;
  ulong extraout_RAX;
  long *plVar6;
  type_error *ptVar7;
  size_type *psVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong unaff_R13;
  unsigned_long __val;
  string sn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (s->_M_string_length == 0) {
    return;
  }
  paVar1 = &this->string_buffer;
  lVar10 = 0;
  __val = 0;
  lVar11 = 0;
  lVar9 = 0;
  bVar5 = 0;
LAB_0019b241:
  eVar3 = this->error_handler;
  do {
    bVar2 = (s->_M_dataplus)._M_p[__val];
    if (bVar5 == 0) {
      uVar12 = 0xffU >> (serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                         ::decode(unsigned_char&,unsigned_int&,unsigned_char)::utf8d[bVar2] & 0x1f)
               & (uint)bVar2;
    }
    else {
      uVar12 = (int)unaff_R13 << 6 | bVar2 & 0x3f;
    }
    unaff_R13 = (ulong)uVar12;
    bVar5 = serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            ::decode(unsigned_char&,unsigned_int&,unsigned_char)::utf8d
            [(ulong)(byte)serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                          ::decode(unsigned_char&,unsigned_int&,unsigned_char)::utf8d[bVar2] +
             (ulong)bVar5 * 0x10 + 0x100];
    if (bVar5 != 1) {
      if (bVar5 == 0) {
        switch(uVar12) {
        case 8:
          (paVar1->_M_elems + lVar10)[0] = '\\';
          (paVar1->_M_elems + lVar10)[1] = 'b';
          break;
        case 9:
          (paVar1->_M_elems + lVar10)[0] = '\\';
          (paVar1->_M_elems + lVar10)[1] = 't';
          break;
        case 10:
          (paVar1->_M_elems + lVar10)[0] = '\\';
          (paVar1->_M_elems + lVar10)[1] = 'n';
          break;
        case 0xb:
switchD_0019b2d6_caseD_b:
          if (uVar12 < 0x20 || ensure_ascii && 0x7e < uVar12) {
            if (uVar12 < 0x10000) {
              snprintf(paVar1->_M_elems + lVar10,7,"\\u%04x",unaff_R13);
              lVar9 = lVar10 + 6;
            }
            else {
              snprintf(paVar1->_M_elems + lVar10,0xd,"\\u%04x\\u%04x",
                       (ulong)((uVar12 >> 10) + 0xd7c0 & 0xffff),(ulong)(uVar12 & 0x3ff | 0xdc00));
              lVar9 = lVar10 + 0xc;
            }
          }
          else {
            paVar1->_M_elems[lVar10] = bVar2;
            lVar9 = lVar10 + 1;
          }
          goto LAB_0019b421;
        case 0xc:
          (paVar1->_M_elems + lVar10)[0] = '\\';
          (paVar1->_M_elems + lVar10)[1] = 'f';
          break;
        case 0xd:
          (paVar1->_M_elems + lVar10)[0] = '\\';
          (paVar1->_M_elems + lVar10)[1] = 'r';
          break;
        default:
          if (uVar12 == 0x22) {
            (paVar1->_M_elems + lVar10)[0] = '\\';
            (paVar1->_M_elems + lVar10)[1] = '\"';
          }
          else {
            if (uVar12 != 0x5c) goto switchD_0019b2d6_caseD_b;
            (paVar1->_M_elems + lVar10)[0] = '\\';
            (paVar1->_M_elems + lVar10)[1] = '\\';
          }
        }
        lVar9 = lVar10 + 2;
LAB_0019b421:
        if (lVar9 - 500U < 0xd) {
          (*((this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_output_adapter_protocol[1])();
          bVar5 = 0;
          lVar11 = 0;
          lVar9 = 0;
          lVar10 = 0;
        }
        else {
          bVar5 = 0;
          lVar11 = 0;
          lVar10 = lVar9;
        }
      }
      else {
        if (!ensure_ascii) {
          paVar1->_M_elems[lVar10] = bVar2;
          lVar10 = lVar10 + 1;
        }
        lVar11 = lVar11 + 1;
      }
      goto LAB_0019b362;
    }
    if (eVar3 - replace < 2) goto LAB_0019b2e7;
    if (eVar3 == strict) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_d0,'\x03');
      snprintf(local_d0._M_dataplus._M_p,local_d0._M_string_length,"%.2X",(ulong)bVar2);
      ptVar7 = (type_error *)__cxa_allocate_exception(0x20);
      std::__cxx11::to_string(&local_70,__val);
      std::operator+(&local_50,"invalid UTF-8 byte at index ",&local_70);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90._M_dataplus._M_p = (pointer)*plVar6;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar8) {
        local_90.field_2._M_allocated_capacity = *psVar8;
        local_90.field_2._8_8_ = plVar6[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar8;
      }
      local_90._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::operator+(&local_b0,&local_90,&local_d0);
      type_error::create(ptVar7,0x13c,&local_b0);
      __cxa_throw(ptVar7,&type_error::typeinfo,exception::~exception);
    }
    __val = __val + 1;
    bVar5 = 1;
  } while (__val < s->_M_string_length);
  goto LAB_0019b4d9;
LAB_0019b2e7:
  __val = (__val - 1) + (ulong)(lVar11 == 0);
  if (eVar3 == replace) {
    if (ensure_ascii) {
      builtin_strncpy(paVar1->_M_elems + lVar9,"\\ufffd",6);
      lVar9 = lVar9 + 6;
      bVar5 = 0;
      lVar11 = 0;
      lVar10 = lVar9;
    }
    else {
      lVar10 = lVar9 + 3;
      (paVar1->_M_elems + lVar9)[0] = -0x11;
      (paVar1->_M_elems + lVar9)[1] = -0x41;
      (this->string_buffer)._M_elems[lVar9 + 2] = -0x43;
      bVar5 = 0;
      lVar11 = 0;
      lVar9 = lVar10;
    }
  }
  else {
    bVar5 = 0;
    lVar11 = 0;
    lVar10 = lVar9;
  }
LAB_0019b362:
  __val = __val + 1;
  if (s->_M_string_length <= __val) {
    if (bVar5 == 0) {
      if (lVar10 == 0) {
        return;
      }
      peVar4 = (this->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar4->_vptr_output_adapter_protocol[1])(peVar4,paVar1,lVar10);
      return;
    }
LAB_0019b4d9:
    serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::dump_escaped();
    if ((extraout_RAX & 1) != 0) {
      return;
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_d0,'\x03');
    snprintf(local_d0._M_dataplus._M_p,local_d0._M_string_length,"%.2X",
             (ulong)(byte)(s->_M_dataplus)._M_p[s->_M_string_length - 1]);
    ptVar7 = (type_error *)__cxa_allocate_exception(0x20);
    std::operator+(&local_b0,"incomplete UTF-8 string; last byte: 0x",&local_d0);
    type_error::create(ptVar7,0x13c,&local_b0);
    __cxa_throw(ptVar7,&type_error::typeinfo,exception::~exception);
  }
  goto LAB_0019b241;
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii) {
		uint32_t codepoint;
		uint8_t state = UTF8_ACCEPT;
		std::size_t bytes = 0;  // number of bytes written to string_buffer

		// number of bytes written at the point of the last valid byte
		std::size_t bytes_after_last_accept = 0;
		std::size_t undumped_chars = 0;

		for (std::size_t i = 0; i < s.size(); ++i) {
			const auto byte = static_cast<uint8_t>(s[i]);

			switch (decode(state, codepoint, byte)) {
				case UTF8_ACCEPT:  // decode found a new code point
				{
					switch (codepoint) {
						case 0x08:  // backspace
						{
							string_buffer[bytes++] = '\\';
							string_buffer[bytes++] = 'b';
							break;
						}

						case 0x09:  // horizontal tab
						{
							string_buffer[bytes++] = '\\';
							string_buffer[bytes++] = 't';
							break;
						}

						case 0x0A:  // newline
						{
							string_buffer[bytes++] = '\\';
							string_buffer[bytes++] = 'n';
							break;
						}

						case 0x0C:  // formfeed
						{
							string_buffer[bytes++] = '\\';
							string_buffer[bytes++] = 'f';
							break;
						}

						case 0x0D:  // carriage return
						{
							string_buffer[bytes++] = '\\';
							string_buffer[bytes++] = 'r';
							break;
						}

						case 0x22:  // quotation mark
						{
							string_buffer[bytes++] = '\\';
							string_buffer[bytes++] = '\"';
							break;
						}

						case 0x5C:  // reverse solidus
						{
							string_buffer[bytes++] = '\\';
							string_buffer[bytes++] = '\\';
							break;
						}

						default: {
							// escape control characters (0x00..0x1F) or, if
							// ensure_ascii parameter is used, non-ASCII characters
							if ((codepoint <= 0x1F) or (ensure_ascii and (codepoint >= 0x7F))) {
								if (codepoint <= 0xFFFF) {
									std::snprintf(string_buffer.data() + bytes, 7, "\\u%04x",
												  static_cast<uint16_t>(codepoint));
									bytes += 6;
								} else {
									std::snprintf(string_buffer.data() + bytes, 13, "\\u%04x\\u%04x",
												  static_cast<uint16_t>(0xD7C0 + (codepoint >> 10)),
												  static_cast<uint16_t>(0xDC00 + (codepoint & 0x3FF)));
									bytes += 12;
								}
							} else {
								// copy byte to buffer (all previous bytes
								// been copied have in default case above)
								string_buffer[bytes++] = s[i];
							}
							break;
						}
					}

					// write buffer and reset index; there must be 13 bytes
					// left, as this is the maximal number of bytes to be
					// written ("\uxxxx\uxxxx\0") for one code point
					if (string_buffer.size() - bytes < 13) {
						o->write_characters(string_buffer.data(), bytes);
						bytes = 0;
					}

					// remember the byte position of this accept
					bytes_after_last_accept = bytes;
					undumped_chars = 0;
					break;
				}

				case UTF8_REJECT:  // decode found invalid UTF-8 byte
				{
					switch (error_handler) {
						case error_handler_t::strict: {
							std::string sn(3, '\0');
							snprintf(&sn[0], sn.size(), "%.2X", byte);
							JSON_THROW(type_error::create(
								316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + sn));
						}

						case error_handler_t::ignore:
						case error_handler_t::replace: {
							// in case we saw this character the first time, we
							// would like to read it again, because the byte
							// may be OK for itself, but just not OK for the
							// previous sequence
							if (undumped_chars > 0) {
								--i;
							}

							// reset length buffer to the last accepted index;
							// thus removing/ignoring the invalid characters
							bytes = bytes_after_last_accept;

							if (error_handler == error_handler_t::replace) {
								// add a replacement character
								if (ensure_ascii) {
									string_buffer[bytes++] = '\\';
									string_buffer[bytes++] = 'u';
									string_buffer[bytes++] = 'f';
									string_buffer[bytes++] = 'f';
									string_buffer[bytes++] = 'f';
									string_buffer[bytes++] = 'd';
								} else {
									string_buffer[bytes++] =
										detail::binary_writer<BasicJsonType, char>::to_char_type('\xEF');
									string_buffer[bytes++] =
										detail::binary_writer<BasicJsonType, char>::to_char_type('\xBF');
									string_buffer[bytes++] =
										detail::binary_writer<BasicJsonType, char>::to_char_type('\xBD');
								}
								bytes_after_last_accept = bytes;
							}

							undumped_chars = 0;

							// continue processing the string
							state = UTF8_ACCEPT;
							break;
						}
					}
					break;
				}

				default:  // decode found yet incomplete multi-byte code point
				{
					if (not ensure_ascii) {
						// code point will not be escaped - copy byte to buffer
						string_buffer[bytes++] = s[i];
					}
					++undumped_chars;
					break;
				}
			}
		}

		// we finished processing the string
		if (JSON_LIKELY(state == UTF8_ACCEPT)) {
			// write buffer
			if (bytes > 0) {
				o->write_characters(string_buffer.data(), bytes);
			}
		} else {
			// we finish reading, but do not accept: string was incomplete
			switch (error_handler) {
				case error_handler_t::strict: {
					std::string sn(3, '\0');
					snprintf(&sn[0], sn.size(), "%.2X", static_cast<uint8_t>(s.back()));
					JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + sn));
				}

				case error_handler_t::ignore: {
					// write all accepted bytes
					o->write_characters(string_buffer.data(), bytes_after_last_accept);
					break;
				}

				case error_handler_t::replace: {
					// write all accepted bytes
					o->write_characters(string_buffer.data(), bytes_after_last_accept);
					// add a replacement character
					if (ensure_ascii) {
						o->write_characters("\\ufffd", 6);
					} else {
						o->write_characters("\xEF\xBF\xBD", 3);
					}
					break;
				}
			}
		}
	}